

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  stbi_uc *psVar2;
  uchar uVar3;
  short sVar4;
  ushort uVar5;
  undefined2 uVar6;
  stbi__uint32 b;
  short sVar7;
  bool bVar8;
  undefined1 auVar9 [8];
  byte bVar10;
  byte bVar11;
  stbi_uc sVar12;
  int iVar13;
  stbi__uint32 sVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  stbi__jpeg *psVar20;
  long lVar21;
  void *pvVar22;
  code *pcVar23;
  uchar *puVar24;
  undefined8 *puVar25;
  undefined8 uVar26;
  uint uVar27;
  ulong uVar28;
  undefined8 *puVar29;
  byte *pbVar30;
  short sVar31;
  ushort *puVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  stbi__context *psVar41;
  uchar *puVar42;
  anon_struct_96_18_0d0905d3 *paVar43;
  ushort *puVar44;
  stbi__uint32 sVar45;
  short *psVar46;
  ulong uVar47;
  undefined8 *puVar48;
  int id;
  uint uVar49;
  bool bVar50;
  undefined1 local_508 [8];
  short data [64];
  int local_d0;
  undefined1 auStack_c8 [8];
  stbi_uc *coutput [4];
  int local_98;
  int local_94;
  uint local_78;
  ulong local_60;
  int local_58;
  uint local_48;
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  psVar20 = (stbi__jpeg *)malloc(0x4888);
  psVar20->s = s;
  psVar20->idct_block_kernel = stbi__idct_simd;
  psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar13 = stbi__decode_jpeg_header(psVar20,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar20);
  if (iVar13 != 0) {
    psVar20 = (stbi__jpeg *)malloc(0x4888);
    psVar20->s = s;
    psVar20->idct_block_kernel = stbi__idct_simd;
    psVar20->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar20->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar21 = 0x46d8; lVar21 != 0x4858; lVar21 = lVar21 + 0x60) {
        psVar2 = psVar20->huff_dc[0].fast + lVar21 + -8;
        psVar2[0] = '\0';
        psVar2[1] = '\0';
        psVar2[2] = '\0';
        psVar2[3] = '\0';
        psVar2[4] = '\0';
        psVar2[5] = '\0';
        psVar2[6] = '\0';
        psVar2[7] = '\0';
        psVar2[8] = '\0';
        psVar2[9] = '\0';
        psVar2[10] = '\0';
        psVar2[0xb] = '\0';
        psVar2[0xc] = '\0';
        psVar2[0xd] = '\0';
        psVar2[0xe] = '\0';
        psVar2[0xf] = '\0';
      }
      psVar20->restart_interval = 0;
      iVar13 = stbi__decode_jpeg_header(psVar20,0);
      if (iVar13 != 0) {
        paVar1 = psVar20->img_comp;
        bVar10 = stbi__get_marker(psVar20);
LAB_0011c754:
        if (bVar10 != 0xda) {
          if (bVar10 == 0xdc) {
            iVar13 = stbi__get16be(psVar20->s);
            sVar14 = stbi__get16be(psVar20->s);
            if (iVar13 == 4) {
              if (sVar14 == psVar20->s->img_y) goto LAB_0011c7aa;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
          }
          else {
            if (bVar10 == 0xd9) {
              if (psVar20->progressive == 0) {
                psVar41 = psVar20->s;
                uVar49 = psVar41->img_n;
              }
              else {
                lVar21 = 0;
                while( true ) {
                  psVar41 = psVar20->s;
                  uVar49 = psVar41->img_n;
                  if ((int)uVar49 <= lVar21) break;
                  uVar49 = psVar20->img_comp[lVar21].x + 7 >> 3;
                  iVar13 = psVar20->img_comp[lVar21].y + 7 >> 3;
                  uVar47 = 0;
                  uVar28 = (ulong)uVar49;
                  if ((int)uVar49 < 1) {
                    uVar28 = uVar47;
                  }
                  if (iVar13 < 1) {
                    iVar13 = 0;
                  }
                  while (iVar19 = (int)uVar47, iVar19 != iVar13) {
                    for (uVar47 = 0; uVar47 != uVar28; uVar47 = uVar47 + 1) {
                      psVar46 = paVar1[lVar21].coeff;
                      iVar38 = paVar1[lVar21].coeff_w * iVar19;
                      iVar18 = paVar1[lVar21].tq;
                      iVar39 = iVar38 + (int)uVar47;
                      for (lVar40 = 0; lVar40 != 0x40; lVar40 = lVar40 + 1) {
                        psVar46[iVar39 * 0x40 + lVar40] =
                             psVar46[iVar39 * 0x40 + lVar40] * psVar20->dequant[iVar18][lVar40];
                      }
                      (*psVar20->idct_block_kernel)
                                (paVar1[lVar21].data +
                                 uVar47 * 8 + (long)(iVar19 * 8 * paVar1[lVar21].w2),
                                 paVar1[lVar21].w2,psVar46 + (iVar38 + (int)uVar47) * 0x40);
                    }
                    uVar47 = (ulong)(iVar19 + 1);
                  }
                  lVar21 = lVar21 + 1;
                }
              }
              uVar28 = (ulong)((2 < (int)uVar49) + 1 + (uint)(2 < (int)uVar49));
              if (req_comp != 0) {
                uVar28 = (ulong)(uint)req_comp;
              }
              lVar21 = 0;
              bVar50 = false;
              if ((uVar49 == 3) && (bVar50 = true, psVar20->rgb != 3)) {
                if (psVar20->app14_color_transform == 0) {
                  bVar50 = psVar20->jfif == 0;
                }
                else {
                  bVar50 = false;
                }
              }
              uVar47 = 0;
              if (0 < (int)uVar49) {
                uVar47 = (ulong)uVar49;
              }
              uVar34 = 1;
              if (bVar50) {
                uVar34 = uVar47;
              }
              iVar13 = (int)uVar28;
              if (2 < iVar13) {
                uVar34 = uVar47;
              }
              coutput[1] = (stbi_uc *)0x0;
              coutput[2] = (stbi_uc *)0x0;
              auStack_c8 = (undefined1  [8])0x0;
              coutput[0] = (stbi_uc *)0x0;
              if (uVar49 != 3) {
                uVar34 = uVar47;
              }
              for (; uVar34 * 0x30 != lVar21; lVar21 = lVar21 + 0x30) {
                sVar14 = psVar41->img_x;
                pvVar22 = malloc((ulong)(sVar14 + 3));
                *(void **)((long)&psVar20->img_comp[0].linebuf + lVar21 * 2) = pvVar22;
                if (pvVar22 == (void *)0x0) {
                  stbi__cleanup_jpeg(psVar20);
                  stbi__g_failure_reason = "outofmem";
                  puVar24 = (uchar *)0x0;
                  goto LAB_0011da1d;
                }
                uVar47 = (long)psVar20->img_h_max /
                         (long)*(int *)((long)&psVar20->img_comp[0].h + lVar21 * 2);
                iVar19 = (int)uVar47;
                *(int *)((long)data + lVar21 + 0x10) = iVar19;
                iVar18 = psVar20->img_v_max / *(int *)((long)&psVar20->img_comp[0].v + lVar21 * 2);
                *(int *)((long)data + lVar21 + 0x14) = iVar18;
                *(int *)((long)data + lVar21 + 0x1c) = iVar18 >> 1;
                *(int *)((long)data + lVar21 + 0x18) =
                     (int)((ulong)((sVar14 + iVar19) - 1) / (uVar47 & 0xffffffff));
                *(undefined4 *)((long)data + lVar21 + 0x20) = 0;
                uVar26 = *(undefined8 *)((long)&psVar20->img_comp[0].data + lVar21 * 2);
                *(undefined8 *)((long)data + lVar21 + 8) = uVar26;
                *(undefined8 *)((long)data + lVar21) = uVar26;
                if (iVar19 == 2) {
                  pcVar23 = stbi__resample_row_h_2;
                  if (iVar18 != 1) {
                    if (iVar18 != 2) goto LAB_0011dfb6;
                    pcVar23 = psVar20->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar19 == 1) {
                  pcVar23 = stbi__resample_row_generic;
                  if (iVar18 == 2) {
                    pcVar23 = stbi__resample_row_v_2;
                  }
                  if (iVar18 == 1) {
                    pcVar23 = resample_row_1;
                  }
                }
                else {
LAB_0011dfb6:
                  pcVar23 = stbi__resample_row_generic;
                }
                *(code **)((long)data + lVar21 + -8) = pcVar23;
              }
              sVar14 = psVar41->img_y;
              puVar24 = (uchar *)stbi__malloc_mad3(iVar13,psVar41->img_x,sVar14,1);
              if (puVar24 != (uchar *)0x0) {
                iVar19 = 0;
                uVar49 = 0;
                do {
                  if (sVar14 <= uVar49) {
                    stbi__cleanup_jpeg(psVar20);
                    psVar41 = psVar20->s;
                    *x = psVar41->img_x;
                    *y = psVar41->img_y;
                    if (comp != (int *)0x0) {
                      *comp = (uint)(2 < psVar41->img_n) * 2 + 1;
                    }
                    goto LAB_0011da1d;
                  }
                  sVar14 = psVar41->img_x;
                  puVar48 = (undefined8 *)auStack_c8;
                  for (lVar21 = 0; uVar34 * 0x30 != lVar21; lVar21 = lVar21 + 0x30) {
                    puVar25 = (undefined8 *)((long)data + lVar21 + 8);
                    iVar18 = *(int *)((long)data + lVar21 + 0x1c);
                    iVar38 = *(int *)((long)data + lVar21 + 0x14);
                    iVar39 = iVar38 >> 1;
                    puVar29 = puVar25;
                    if (iVar18 < iVar39) {
                      puVar29 = (undefined8 *)((long)data + lVar21);
                    }
                    if (iVar39 <= iVar18) {
                      puVar25 = (undefined8 *)((long)data + lVar21);
                    }
                    uVar26 = (**(code **)((long)data + lVar21 + -8))
                                       (*(undefined8 *)
                                         ((long)&psVar20->img_comp[0].linebuf + lVar21 * 2),*puVar29
                                        ,*puVar25,*(undefined4 *)((long)data + lVar21 + 0x18));
                    *puVar48 = uVar26;
                    *(int *)((long)data + lVar21 + 0x1c) = iVar18 + 1;
                    if (iVar38 <= iVar18 + 1) {
                      *(undefined4 *)((long)data + lVar21 + 0x1c) = 0;
                      lVar40 = *(long *)((long)data + lVar21 + 8);
                      *(long *)((long)data + lVar21) = lVar40;
                      iVar18 = *(int *)((long)data + lVar21 + 0x20) + 1;
                      *(int *)((long)data + lVar21 + 0x20) = iVar18;
                      if (iVar18 < *(int *)((long)&psVar20->img_comp[0].y + lVar21 * 2)) {
                        *(long *)((long)data + lVar21 + 8) =
                             lVar40 + *(int *)((long)&psVar20->img_comp[0].w2 + lVar21 * 2);
                      }
                    }
                    puVar48 = puVar48 + 1;
                  }
                  if (iVar13 < 3) {
                    psVar41 = psVar20->s;
                    if (bVar50) {
                      if (iVar13 == 1) {
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          puVar24[uVar47 + sVar14 * iVar19] =
                               (uchar)((uint)coutput[1][uVar47] * 0x1d +
                                       (uint)coutput[0][uVar47] * 0x96 +
                                       (uint)*(byte *)((long)auStack_c8 + uVar47) * 0x4d >> 8);
                        }
                      }
                      else {
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          puVar24[uVar47 * 2 + (ulong)(sVar14 * iVar19)] =
                               (uchar)((uint)coutput[1][uVar47] * 0x1d +
                                       (uint)coutput[0][uVar47] * 0x96 +
                                       (uint)*(byte *)((long)auStack_c8 + uVar47) * 0x4d >> 8);
                          puVar24[uVar47 * 2 + (ulong)(sVar14 * iVar19) + 1] = 0xff;
                        }
                      }
                    }
                    else if (psVar41->img_n == 4) {
                      if (psVar20->app14_color_transform == 2) {
                        puVar42 = puVar24 + (ulong)(sVar14 * iVar19) + 1;
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          iVar18 = (*(byte *)((long)auStack_c8 + uVar47) ^ 0xff) *
                                   (uint)coutput[2][uVar47];
                          puVar42[-1] = (uchar)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          *puVar42 = 0xff;
                          puVar42 = puVar42 + uVar28;
                        }
                      }
                      else {
                        if (psVar20->app14_color_transform != 0) goto LAB_0011e444;
                        puVar42 = puVar24 + (ulong)(sVar14 * iVar19) + 1;
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          bVar10 = coutput[2][uVar47];
                          iVar18 = (uint)*(byte *)((long)auStack_c8 + uVar47) * (uint)bVar10;
                          iVar38 = (uint)coutput[0][uVar47] * (uint)bVar10;
                          puVar42[-1] = (uchar)((((uint)coutput[1][uVar47] * (uint)bVar10 + 0x80 >>
                                                 8) + (uint)coutput[1][uVar47] * (uint)bVar10 + 0x80
                                                >> 8) * 0x1d +
                                                (iVar38 + (iVar38 + 0x80U >> 8) + 0x80 >> 8) * 0x96
                                                + (iVar18 + (iVar18 + 0x80U >> 8) + 0x80 >> 8) *
                                                  0x4d >> 8);
                          *puVar42 = 0xff;
                          puVar42 = puVar42 + uVar28;
                        }
                      }
                    }
                    else {
LAB_0011e444:
                      if (iVar13 == 1) {
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          puVar24[uVar47 + sVar14 * iVar19] = *(uchar *)((long)auStack_c8 + uVar47);
                        }
                      }
                      else {
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          puVar24[uVar47 * 2 + (ulong)(sVar14 * iVar19)] =
                               *(uchar *)((long)auStack_c8 + uVar47);
                          puVar24[uVar47 * 2 + (ulong)(sVar14 * iVar19) + 1] = 0xff;
                        }
                      }
                    }
                  }
                  else {
                    psVar41 = psVar20->s;
                    if (psVar41->img_n == 3) {
                      if (bVar50) {
                        puVar42 = puVar24 + (ulong)(sVar14 * iVar19) + 3;
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          puVar42[-3] = *(uchar *)((long)auStack_c8 + uVar47);
                          puVar42[-2] = coutput[0][uVar47];
                          puVar42[-1] = coutput[1][uVar47];
                          *puVar42 = 0xff;
                          puVar42 = puVar42 + uVar28;
                        }
                      }
                      else {
LAB_0011e47e:
                        (*psVar20->YCbCr_to_RGB_kernel)
                                  (puVar24 + uVar49 * iVar13 * sVar14,(stbi_uc *)auStack_c8,
                                   coutput[0],coutput[1],psVar41->img_x,iVar13);
                      }
                    }
                    else if (psVar41->img_n == 4) {
                      if (psVar20->app14_color_transform == 2) {
                        (*psVar20->YCbCr_to_RGB_kernel)
                                  (puVar24 + uVar49 * iVar13 * sVar14,(stbi_uc *)auStack_c8,
                                   coutput[0],coutput[1],psVar41->img_x,iVar13);
                        psVar41 = psVar20->s;
                        pbVar30 = puVar24 + (ulong)(sVar14 * iVar19) + 2;
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          bVar10 = coutput[2][uVar47];
                          iVar18 = (pbVar30[-2] ^ 0xff) * (uint)bVar10;
                          pbVar30[-2] = (byte)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          iVar18 = (pbVar30[-1] ^ 0xff) * (uint)bVar10;
                          pbVar30[-1] = (byte)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          iVar18 = (*pbVar30 ^ 0xff) * (uint)bVar10;
                          *pbVar30 = (byte)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          pbVar30 = pbVar30 + uVar28;
                        }
                      }
                      else {
                        if (psVar20->app14_color_transform != 0) goto LAB_0011e47e;
                        puVar42 = puVar24 + (ulong)(sVar14 * iVar19) + 3;
                        for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                          bVar10 = coutput[2][uVar47];
                          iVar18 = (uint)*(byte *)((long)auStack_c8 + uVar47) * (uint)bVar10;
                          puVar42[-3] = (uchar)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          iVar18 = (uint)coutput[0][uVar47] * (uint)bVar10;
                          puVar42[-2] = (uchar)((iVar18 + 0x80U >> 8) + iVar18 + 0x80 >> 8);
                          puVar42[-1] = (uchar)(((uint)coutput[1][uVar47] * (uint)bVar10 + 0x80 >> 8
                                                ) + (uint)coutput[1][uVar47] * (uint)bVar10 + 0x80
                                               >> 8);
                          *puVar42 = 0xff;
                          puVar42 = puVar42 + uVar28;
                        }
                      }
                    }
                    else {
                      puVar42 = puVar24 + (ulong)(sVar14 * iVar19) + 3;
                      for (uVar47 = 0; uVar47 < psVar41->img_x; uVar47 = uVar47 + 1) {
                        uVar3 = *(uchar *)((long)auStack_c8 + uVar47);
                        puVar42[-1] = uVar3;
                        puVar42[-2] = uVar3;
                        puVar42[-3] = uVar3;
                        *puVar42 = 0xff;
                        puVar42 = puVar42 + uVar28;
                      }
                    }
                  }
                  uVar49 = uVar49 + 1;
                  psVar41 = psVar20->s;
                  sVar14 = psVar41->img_y;
                  iVar19 = iVar19 + iVar13;
                } while( true );
              }
              stbi__cleanup_jpeg(psVar20);
              stbi__g_failure_reason = "outofmem";
              goto LAB_0011da17;
            }
            iVar13 = stbi__process_marker(psVar20,(uint)bVar10);
            if (iVar13 != 0) goto LAB_0011c7aa;
          }
          goto LAB_0011da0b;
        }
        iVar13 = stbi__get16be(psVar20->s);
        bVar10 = stbi__get8(psVar20->s);
        uVar49 = (uint)bVar10;
        psVar20->scan_n = (uint)bVar10;
        if (((byte)(bVar10 - 5) < 0xfc) ||
           (psVar41 = psVar20->s, psVar41->img_n < (int)(uint)bVar10)) {
          stbi__g_failure_reason = "bad SOS component count";
        }
        else {
          if (iVar13 == (uint)bVar10 * 2 + 6) {
            lVar21 = 0;
            while( true ) {
              bVar10 = stbi__get8(psVar41);
              if ((int)uVar49 <= lVar21) break;
              bVar11 = stbi__get8(psVar20->s);
              psVar41 = psVar20->s;
              uVar49 = psVar41->img_n;
              uVar28 = 0;
              if (0 < (int)uVar49) {
                uVar28 = (ulong)uVar49;
              }
              paVar43 = paVar1;
              for (uVar47 = 0; uVar28 != uVar47; uVar47 = uVar47 + 1) {
                if (paVar43->id == (uint)bVar10) {
                  uVar28 = uVar47 & 0xffffffff;
                  break;
                }
                paVar43 = paVar43 + 1;
              }
              if ((uint)uVar28 == uVar49) goto LAB_0011da0b;
              psVar20->img_comp[uVar28].hd = (uint)(bVar11 >> 4);
              if (0x3f < bVar11) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0011da0b;
              }
              paVar1[uVar28].ha = bVar11 & 0xf;
              if (3 < (bVar11 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0011da0b;
              }
              psVar20->order[lVar21] = (uint)uVar28;
              lVar21 = lVar21 + 1;
              uVar49 = psVar20->scan_n;
            }
            psVar20->spec_start = (uint)bVar10;
            bVar10 = stbi__get8(psVar20->s);
            psVar20->spec_end = (uint)bVar10;
            bVar10 = stbi__get8(psVar20->s);
            psVar20->succ_high = (uint)(bVar10 >> 4);
            psVar20->succ_low = bVar10 & 0xf;
            iVar13 = psVar20->spec_start;
            if (psVar20->progressive == 0) {
              if ((iVar13 != 0) || ((0xf < bVar10 || ((bVar10 & 0xf) != 0)))) {
LAB_0011d9fd:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_0011da0b;
              }
              psVar20->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar13) || (0x3f < psVar20->spec_end)) ||
                     (psVar20->spec_end < iVar13)) || ((0xdf < bVar10 || (0xd < (bVar10 & 0xf)))))
            goto LAB_0011d9fd;
            stbi__jpeg_reset(psVar20);
            if (psVar20->progressive == 0) {
              if (psVar20->scan_n == 1) {
                iVar13 = psVar20->order[0];
                uVar49 = psVar20->img_comp[iVar13].x + 7 >> 3;
                iVar19 = psVar20->img_comp[iVar13].y + 7 >> 3;
                if ((int)uVar49 < 1) {
                  uVar49 = 0;
                }
                iVar18 = 0;
                if (iVar19 < 1) {
                  iVar19 = 0;
                }
                for (iVar38 = 0; iVar38 != iVar19; iVar38 = iVar38 + 1) {
                  for (lVar21 = 0; (ulong)uVar49 * 8 != lVar21; lVar21 = lVar21 + 8) {
                    iVar39 = stbi__jpeg_decode_block
                                       (psVar20,(short *)local_508,
                                        psVar20->huff_dc + paVar1[iVar13].hd,
                                        psVar20->huff_ac + paVar1[iVar13].ha,
                                        psVar20->fast_ac[paVar1[iVar13].ha],iVar13,
                                        psVar20->dequant[paVar1[iVar13].tq]);
                    if (iVar39 == 0) goto LAB_0011d15c;
                    (*psVar20->idct_block_kernel)
                              (paVar1[iVar13].data + lVar21 + iVar18 * paVar1[iVar13].w2,
                               paVar1[iVar13].w2,(short *)local_508);
                    iVar39 = psVar20->todo;
                    psVar20->todo = iVar39 + -1;
                    if (iVar39 < 2) {
                      if (psVar20->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar20);
                      }
                      if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_0011d1af;
                      stbi__jpeg_reset(psVar20);
                    }
                  }
                  iVar18 = iVar18 + 8;
                }
              }
              else {
                for (iVar13 = 0; iVar13 < psVar20->img_mcu_y; iVar13 = iVar13 + 1) {
                  for (iVar19 = 0; iVar19 < psVar20->img_mcu_x; iVar19 = iVar19 + 1) {
                    for (lVar21 = 0; lVar21 < psVar20->scan_n; lVar21 = lVar21 + 1) {
                      iVar18 = psVar20->order[lVar21];
                      for (iVar38 = 0; iVar38 < paVar1[iVar18].v; iVar38 = iVar38 + 1) {
                        iVar39 = 0;
                        while( true ) {
                          iVar15 = paVar1[iVar18].h;
                          if (iVar15 <= iVar39) break;
                          iVar35 = paVar1[iVar18].v;
                          iVar16 = stbi__jpeg_decode_block
                                             (psVar20,(short *)local_508,
                                              psVar20->huff_dc + paVar1[iVar18].hd,
                                              psVar20->huff_ac + paVar1[iVar18].ha,
                                              psVar20->fast_ac[paVar1[iVar18].ha],iVar18,
                                              psVar20->dequant[paVar1[iVar18].tq]);
                          if (iVar16 == 0) goto LAB_0011d15c;
                          (*psVar20->idct_block_kernel)
                                    (paVar1[iVar18].data +
                                     (long)((iVar15 * iVar19 + iVar39) * 8) +
                                     (long)((iVar35 * iVar13 + iVar38) * paVar1[iVar18].w2 * 8),
                                     paVar1[iVar18].w2,(short *)local_508);
                          iVar39 = iVar39 + 1;
                        }
                      }
                    }
                    iVar18 = psVar20->todo;
                    psVar20->todo = iVar18 + -1;
                    if (iVar18 < 2) {
                      if (psVar20->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar20);
                      }
                      if ((psVar20->marker & 0xf8) != 0xd0) goto LAB_0011d1af;
                      stbi__jpeg_reset(psVar20);
                    }
                  }
                }
              }
LAB_0011d1af:
              bVar50 = true;
              goto LAB_0011d15e;
            }
            if (psVar20->scan_n == 1) {
              iVar13 = psVar20->order[0];
              iVar19 = psVar20->img_comp[iVar13].x + 7 >> 3;
              iVar18 = psVar20->img_comp[iVar13].y + 7 >> 3;
              iVar38 = 0;
              if (iVar19 < 1) {
                iVar19 = iVar38;
              }
              if (iVar18 < 1) {
                iVar18 = iVar38;
              }
              for (; iVar38 != iVar18; iVar38 = iVar38 + 1) {
                for (iVar39 = 0; iVar39 != iVar19; iVar39 = iVar39 + 1) {
                  psVar46 = paVar1[iVar13].coeff + (paVar1[iVar13].coeff_w * iVar38 + iVar39) * 0x40
                  ;
                  uVar28 = (ulong)psVar20->spec_start;
                  if (uVar28 == 0) {
                    iVar15 = stbi__jpeg_decode_block_prog_dc
                                       (psVar20,psVar46,psVar20->huff_dc + paVar1[iVar13].hd,iVar13)
                    ;
                    if (iVar15 == 0) goto LAB_0011da0b;
                  }
                  else {
                    iVar15 = paVar1[iVar13].ha;
                    iVar35 = psVar20->eob_run;
                    bVar10 = (byte)psVar20->succ_low;
                    if (psVar20->succ_high == 0) {
                      if (iVar35 == 0) {
                        do {
                          if (psVar20->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(psVar20);
                          }
                          sVar31 = psVar20->fast_ac[iVar15][psVar20->code_buffer >> 0x17];
                          uVar49 = (uint)sVar31;
                          iVar35 = (int)uVar28;
                          if (sVar31 == 0) {
                            uVar49 = stbi__jpeg_huff_decode(psVar20,psVar20->huff_ac + iVar15);
                            if ((int)uVar49 < 0) goto LAB_0011d74b;
                            uVar37 = uVar49 >> 4;
                            if ((uVar49 & 0xf) == 0) {
                              if (uVar49 < 0xf0) {
                                iVar35 = 1 << ((byte)uVar37 & 0x1f);
                                psVar20->eob_run = iVar35;
                                if (0xf < uVar49) {
                                  iVar35 = stbi__jpeg_get_bits(psVar20,uVar37);
                                  iVar35 = iVar35 + psVar20->eob_run;
                                }
                                goto LAB_0011caed;
                              }
                              uVar28 = (ulong)(iVar35 + 0x10);
                            }
                            else {
                              lVar21 = (ulong)uVar37 + (long)iVar35;
                              uVar28 = (ulong)((int)lVar21 + 1);
                              bVar11 = ""[lVar21];
                              iVar35 = stbi__extend_receive(psVar20,uVar49 & 0xf);
                              psVar46[bVar11] = (short)(iVar35 << (bVar10 & 0x1f));
                            }
                          }
                          else {
                            lVar21 = (ulong)(uVar49 >> 4 & 0xf) + (long)iVar35;
                            psVar20->code_buffer = psVar20->code_buffer << (sbyte)(uVar49 & 0xf);
                            psVar20->code_bits = psVar20->code_bits - (uVar49 & 0xf);
                            uVar28 = (ulong)((int)lVar21 + 1);
                            psVar46[""[lVar21]] = (short)((uVar49 >> 8) << (bVar10 & 0x1f));
                          }
                        } while ((int)uVar28 <= psVar20->spec_end);
                      }
                      else {
LAB_0011caed:
                        psVar20->eob_run = iVar35 + -1;
                      }
                    }
                    else if (iVar35 == 0) {
                      iVar35 = 0x10000 << (bVar10 & 0x1f);
                      do {
                        uVar49 = stbi__jpeg_huff_decode(psVar20,psVar20->huff_ac + iVar15);
                        if ((int)uVar49 < 0) goto LAB_0011d74b;
                        uVar37 = uVar49 >> 4;
                        if ((uVar49 & 0xf) == 1) {
                          iVar16 = stbi__jpeg_get_bit(psVar20);
                          iVar36 = 1;
                          if (iVar16 == 0) {
                            iVar36 = 0xffff;
                          }
                          sVar31 = (short)(iVar36 << (bVar10 & 0x1f));
                        }
                        else {
                          if ((uVar49 & 0xf) != 0) goto LAB_0011d74b;
                          if (uVar49 < 0xf0) {
                            psVar20->eob_run = ~(-1 << ((byte)uVar37 & 0x1f));
                            if (0xf < uVar49) {
                              iVar16 = stbi__jpeg_get_bits(psVar20,uVar37);
                              psVar20->eob_run = psVar20->eob_run + iVar16;
                            }
                            uVar37 = 0x40;
                          }
                          else {
                            uVar37 = 0xf;
                          }
                          sVar31 = 0;
                        }
                        uVar47 = (long)(int)uVar28;
                        do {
                          while( true ) {
                            uVar28 = uVar47;
                            iVar16 = psVar20->spec_end;
                            if ((long)iVar16 < (long)uVar28) goto LAB_0011cc01;
                            bVar11 = ""[uVar28];
                            if (psVar46[bVar11] == 0) break;
                            iVar16 = stbi__jpeg_get_bit(psVar20);
                            if ((iVar16 != 0) &&
                               (sVar4 = psVar46[bVar11], (iVar35 >> 0x10 & (int)sVar4) == 0)) {
                              sVar7 = (short)((uint)iVar35 >> 0x10);
                              if (sVar4 < 1) {
                                sVar7 = -sVar7;
                              }
                              psVar46[bVar11] = sVar4 + sVar7;
                            }
                            uVar47 = uVar28 + 1;
                          }
                          bVar50 = uVar37 != 0;
                          uVar37 = uVar37 - 1;
                          uVar47 = uVar28 + 1;
                        } while (bVar50);
                        psVar46[bVar11] = sVar31;
                        uVar28 = uVar28 + 1;
LAB_0011cc01:
                      } while ((int)uVar28 <= iVar16);
                    }
                    else {
                      psVar20->eob_run = iVar35 + -1;
                      uVar49 = (0x10000 << (bVar10 & 0x1f)) >> 0x10;
                      for (; (long)uVar28 <= (long)psVar20->spec_end; uVar28 = uVar28 + 1) {
                        bVar10 = ""[uVar28];
                        if (((psVar46[bVar10] != 0) &&
                            (iVar15 = stbi__jpeg_get_bit(psVar20), iVar15 != 0)) &&
                           (sVar31 = psVar46[bVar10], (uVar49 & (int)sVar31) == 0)) {
                          uVar37 = -uVar49;
                          if (0 < sVar31) {
                            uVar37 = uVar49;
                          }
                          psVar46[bVar10] = (short)uVar37 + sVar31;
                        }
                      }
                    }
                  }
                  iVar15 = psVar20->todo;
                  psVar20->todo = iVar15 + -1;
                  if (iVar15 < 2) {
                    if (psVar20->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar20);
                    }
                    bVar10 = psVar20->marker;
                    if ((bVar10 & 0xf8) != 0xd0) goto LAB_0011d170;
                    stbi__jpeg_reset(psVar20);
                  }
                }
              }
            }
            else {
              for (iVar13 = 0; iVar13 < psVar20->img_mcu_y; iVar13 = iVar13 + 1) {
                for (iVar19 = 0; iVar19 < psVar20->img_mcu_x; iVar19 = iVar19 + 1) {
                  for (lVar21 = 0; lVar21 < psVar20->scan_n; lVar21 = lVar21 + 1) {
                    iVar18 = psVar20->order[lVar21];
                    for (iVar38 = 0; iVar38 < paVar1[iVar18].v; iVar38 = iVar38 + 1) {
                      iVar39 = 0;
                      while (iVar39 < paVar1[iVar18].h) {
                        iVar15 = stbi__jpeg_decode_block_prog_dc
                                           (psVar20,paVar1[iVar18].coeff +
                                                    (paVar1[iVar18].h * iVar19 + iVar39 +
                                                    (paVar1[iVar18].v * iVar13 + iVar38) *
                                                    paVar1[iVar18].coeff_w) * 0x40,
                                            psVar20->huff_dc + paVar1[iVar18].hd,iVar18);
                        iVar39 = iVar39 + 1;
                        if (iVar15 == 0) goto LAB_0011da0b;
                      }
                    }
                  }
                  iVar18 = psVar20->todo;
                  psVar20->todo = iVar18 + -1;
                  if (iVar18 < 2) {
                    if (psVar20->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar20);
                    }
                    bVar10 = psVar20->marker;
                    if ((bVar10 & 0xf8) != 0xd0) goto LAB_0011d170;
                    stbi__jpeg_reset(psVar20);
                  }
                }
              }
            }
            goto LAB_0011d166;
          }
          stbi__g_failure_reason = "bad SOS len";
        }
      }
LAB_0011da0b:
      stbi__cleanup_jpeg(psVar20);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0011da17:
    puVar24 = (uchar *)0x0;
LAB_0011da1d:
    free(psVar20);
    return puVar24;
  }
  iVar13 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar13 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_508 = (undefined1  [8])s;
    iVar13 = stbi__parse_png_file((stbi__png *)local_508,0,req_comp);
    auVar9 = local_508;
    if (iVar13 == 0) {
      puVar24 = (uchar *)0x0;
    }
    else {
      iVar13 = 8;
      if (8 < (int)data._24_4_) {
        iVar13 = data._24_4_;
      }
      ri->bits_per_channel = iVar13;
      puVar24 = (uchar *)data._16_8_;
      if ((req_comp != 0) && (iVar13 = *(int *)((long)local_508 + 0xc), iVar13 != req_comp)) {
        uVar49 = *(stbi__uint32 *)local_508;
        uVar37 = *(stbi__uint32 *)((long)local_508 + 4);
        if ((int)data._24_4_ < 9) {
          puVar24 = stbi__convert_format((uchar *)data._16_8_,iVar13,req_comp,uVar49,uVar37);
        }
        else {
          puVar24 = (uchar *)malloc((ulong)(req_comp * uVar49 * uVar37 * 2));
          if (puVar24 == (uchar *)0x0) {
            free((void *)data._16_8_);
            stbi__g_failure_reason = "outofmem";
            *(int *)((long)auVar9 + 0xc) = req_comp;
            return (void *)0x0;
          }
          iVar19 = req_comp + iVar13 * 8;
          uVar27 = 0;
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          iVar18 = uVar49 - 1;
          uVar28 = 0;
          for (uVar47 = 0; uVar47 != uVar37; uVar47 = uVar47 + 1) {
            if (0x19 < iVar19 - 10U) {
switchD_0011d48c_caseD_d:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                            ,0x682,
                            "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                           );
            }
            lVar40 = data._16_8_ + uVar28 * 2;
            uVar34 = (ulong)uVar27;
            lVar21 = uVar34 * 2;
            iVar38 = uVar49 * (int)uVar47;
            puVar44 = (ushort *)(data._16_8_ + (ulong)(uint)(iVar38 * iVar13) * 2);
            puVar32 = (ushort *)(puVar24 + (ulong)(uint)(iVar38 * req_comp) * 2);
            switch(iVar19) {
            case 10:
              lVar21 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *(undefined2 *)(puVar24 + lVar21 * 2 + uVar34 * 2) =
                     *(undefined2 *)(lVar40 + lVar21);
                (puVar24 + lVar21 * 2 + uVar34 * 2 + 2)[0] = 0xff;
                (puVar24 + lVar21 * 2 + uVar34 * 2 + 2)[1] = 0xff;
                lVar21 = lVar21 + 2;
              }
              break;
            case 0xb:
              puVar32 = (ushort *)(puVar24 + uVar34 * 2 + 4);
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                uVar5 = *puVar44;
                *puVar32 = uVar5;
                puVar32[-1] = uVar5;
                puVar32[-2] = uVar5;
                puVar44 = puVar44 + 1;
                puVar32 = puVar32 + 3;
              }
              break;
            case 0xc:
              lVar33 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                uVar6 = *(undefined2 *)(lVar40 + lVar33);
                *(undefined2 *)(puVar24 + lVar33 * 4 + lVar21 + 4) = uVar6;
                *(undefined2 *)(puVar24 + lVar33 * 4 + lVar21 + 2) = uVar6;
                *(undefined2 *)(puVar24 + lVar33 * 4 + lVar21) = uVar6;
                (puVar24 + lVar33 * 4 + lVar21 + 6)[0] = 0xff;
                (puVar24 + lVar33 * 4 + lVar21 + 6)[1] = 0xff;
                lVar33 = lVar33 + 2;
              }
              break;
            default:
              goto switchD_0011d48c_caseD_d;
            case 0x11:
              lVar21 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *(undefined2 *)(puVar24 + lVar21 + uVar34 * 2) =
                     *(undefined2 *)(lVar40 + lVar21 * 2);
                lVar21 = lVar21 + 2;
              }
              break;
            case 0x13:
              puVar32 = (ushort *)(puVar24 + uVar34 * 2 + 4);
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                uVar5 = *puVar44;
                *puVar32 = uVar5;
                puVar32[-1] = uVar5;
                puVar32[-2] = uVar5;
                puVar44 = puVar44 + 2;
                puVar32 = puVar32 + 3;
              }
              break;
            case 0x14:
              lVar33 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                uVar6 = *(undefined2 *)(lVar40 + lVar33);
                *(undefined2 *)(puVar24 + lVar33 * 2 + lVar21 + 4) = uVar6;
                *(undefined2 *)(puVar24 + lVar33 * 2 + lVar21 + 2) = uVar6;
                *(undefined2 *)(puVar24 + lVar33 * 2 + lVar21) = uVar6;
                *(undefined2 *)(puVar24 + lVar33 * 2 + lVar21 + 6) =
                     *(undefined2 *)(lVar40 + 2 + lVar33);
                lVar33 = lVar33 + 4;
              }
              break;
            case 0x19:
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *puVar32 = (ushort)((uint)puVar44[2] * 0x1d +
                                    (uint)puVar44[1] * 0x96 + (uint)*puVar44 * 0x4d >> 8);
                puVar44 = puVar44 + 3;
                puVar32 = puVar32 + 1;
              }
              break;
            case 0x1a:
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *puVar32 = (ushort)((uint)puVar44[2] * 0x1d +
                                    (uint)puVar44[1] * 0x96 + (uint)*puVar44 * 0x4d >> 8);
                puVar32[1] = 0xffff;
                puVar44 = puVar44 + 3;
                puVar32 = puVar32 + 2;
              }
              break;
            case 0x1c:
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *puVar32 = *puVar44;
                puVar32[1] = puVar44[1];
                puVar32[2] = puVar44[2];
                puVar32[3] = 0xffff;
                puVar44 = puVar44 + 3;
                puVar32 = puVar32 + 4;
              }
              break;
            case 0x21:
              lVar21 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *(short *)(puVar24 + lVar21 + uVar34 * 2) =
                     (short)((uint)*(ushort *)(lVar40 + 4 + lVar21 * 4) * 0x1d +
                             (uint)*(ushort *)(lVar40 + 2 + lVar21 * 4) * 0x96 +
                             (uint)*(ushort *)(lVar40 + lVar21 * 4) * 0x4d >> 8);
                lVar21 = lVar21 + 2;
              }
              break;
            case 0x22:
              lVar21 = 0;
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *(short *)(puVar24 + lVar21 + uVar34 * 2) =
                     (short)((uint)*(ushort *)(lVar40 + 4 + lVar21 * 2) * 0x1d +
                             (uint)*(ushort *)(lVar40 + 2 + lVar21 * 2) * 0x96 +
                             (uint)*(ushort *)(lVar40 + lVar21 * 2) * 0x4d >> 8);
                *(undefined2 *)(puVar24 + lVar21 + uVar34 * 2 + 2) =
                     *(undefined2 *)(lVar40 + 6 + lVar21 * 2);
                lVar21 = lVar21 + 4;
              }
              break;
            case 0x23:
              for (iVar38 = iVar18; -1 < iVar38; iVar38 = iVar38 + -1) {
                *puVar32 = *puVar44;
                puVar32[1] = puVar44[1];
                puVar32[2] = puVar44[2];
                puVar44 = puVar44 + 4;
                puVar32 = puVar32 + 3;
              }
            }
            uVar28 = (ulong)((int)uVar28 + iVar13 * uVar49);
            uVar27 = uVar27 + req_comp * uVar49;
          }
          free((void *)data._16_8_);
        }
        *(int *)((long)auVar9 + 0xc) = req_comp;
        if (puVar24 == (uchar *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)auVar9;
      *y = *(stbi__uint32 *)((long)auVar9 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)((long)auVar9 + 8);
      }
      data._16_8_ = (void *)0x0;
    }
    free((void *)data._16_8_);
    free((void *)data._8_8_);
    psVar20 = (stbi__jpeg *)data._0_8_;
    goto LAB_0011da1d;
  }
  sVar12 = stbi__get8(s);
  if ((sVar12 != 'B') || (sVar12 = stbi__get8(s), sVar12 != 'M')) {
LAB_0011d356:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    stbi__g_failure_reason = "unknown image type";
    return (void *)0x0;
  }
  stbi__get32le(s);
  stbi__get16le(s);
  stbi__get16le(s);
  stbi__get32le(s);
  sVar14 = stbi__get32le(s);
  if (((0x38 < sVar14) || ((0x100010000001000U >> ((ulong)sVar14 & 0x3f) & 1) == 0)) &&
     ((sVar14 != 0x7c && (sVar14 != 0x6c)))) goto LAB_0011d356;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  coutput[2] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[2]);
  pvVar22 = stbi__bmp_parse_header(s,(stbi__bmp_data *)auStack_c8);
  if (pvVar22 == (void *)0x0) {
    return (void *)0x0;
  }
  sVar14 = s->img_y;
  sVar45 = -sVar14;
  if (0 < (int)sVar14) {
    sVar45 = sVar14;
  }
  s->img_y = sVar45;
  uVar49 = (uint)coutput[2];
  local_78 = coutput[2]._4_4_;
  if ((int)coutput[0] == 0xc) {
    if ((int)auStack_c8._0_4_ < 0x18) {
      local_60 = (long)(auStack_c8._4_4_ + -0x26) / 3 & 0xffffffff;
      goto LAB_0011d7a5;
    }
LAB_0011d77a:
    local_60 = 0;
    if (auStack_c8._0_4_ != 0x18 || (uint)coutput[2] != 0xff000000) goto LAB_0011d7a5;
    local_60 = 0;
    iVar13 = 3;
    iVar19 = 0x18;
    bVar50 = true;
  }
  else {
    if (0xf < (int)auStack_c8._0_4_) goto LAB_0011d77a;
    local_60 = (ulong)(uint)((auStack_c8._4_4_ - (int)coutput[0]) + -0xe >> 2);
LAB_0011d7a5:
    bVar50 = (uint)coutput[2] == 0xff000000;
    iVar13 = 4 - (uint)((uint)coutput[2] == 0);
    iVar19 = auStack_c8._0_4_;
  }
  s->img_n = iVar13;
  if (2 < req_comp) {
    iVar13 = req_comp;
  }
  b = s->img_x;
  iVar18 = stbi__mad3sizes_valid(iVar13,b,sVar45,0);
  if (iVar18 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  puVar24 = (uchar *)stbi__malloc_mad3(iVar13,b,sVar45,0);
  if (puVar24 == (uchar *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  if (iVar19 < 0x10) {
    iVar18 = (int)local_60;
    if (0x100 < iVar18 || iVar18 == 0) {
      free(puVar24);
      stbi__g_failure_reason = "invalid";
      return (void *)0x0;
    }
    uVar47 = 0;
    uVar28 = 0;
    if (0 < iVar18) {
      uVar28 = local_60;
    }
    for (; uVar28 != uVar47; uVar47 = uVar47 + 1) {
      sVar12 = stbi__get8(s);
      *(stbi_uc *)(data + uVar47 * 2 + -3) = sVar12;
      sVar12 = stbi__get8(s);
      *(stbi_uc *)((long)data + uVar47 * 4 + -7) = sVar12;
      sVar12 = stbi__get8(s);
      *(stbi_uc *)(data + uVar47 * 2 + -4) = sVar12;
      if ((int)coutput[0] != 0xc) {
        stbi__get8(s);
      }
      *(undefined1 *)((long)data + uVar47 * 4 + -5) = 0xff;
    }
    stbi__skip(s,(iVar18 * ((int)coutput[0] == 0xc | 0xfffffffc) - (int)coutput[0]) +
                 auStack_c8._4_4_ + -0xe);
    if (iVar19 == 1) {
      local_48 = -(s->img_x + 7 >> 3) & 3;
      iVar19 = 0;
      uVar28 = 0;
LAB_0011e78c:
      sVar45 = s->img_y;
      if (iVar19 < (int)sVar45) {
        iVar18 = 0;
        do {
          bVar10 = stbi__get8(s);
          sVar45 = s->img_x;
          iVar38 = 8;
          do {
            if ((int)sVar45 <= iVar18) {
LAB_0011e82a:
              uVar28 = uVar28 & 0xffffffff;
              stbi__skip(s,local_48);
              iVar19 = iVar19 + 1;
              goto LAB_0011e78c;
            }
            uVar47 = (ulong)((bVar10 >> (iVar38 - 1U & 0x1f) & 1) != 0);
            iVar39 = (int)uVar28;
            lVar21 = (long)iVar39;
            uVar28 = lVar21 + 3;
            puVar24[lVar21] = (uchar)data[uVar47 * 2 + -4];
            puVar24[lVar21 + 1] = *(uchar *)((long)data + uVar47 * 4 + -7);
            puVar24[lVar21 + 2] = (uchar)data[uVar47 * 2 + -3];
            if (iVar13 == 4) {
              puVar24[uVar28] = 0xff;
              uVar28 = (ulong)(iVar39 + 4);
            }
            if (sVar45 - 1 == iVar18) goto LAB_0011e82a;
            iVar18 = iVar18 + 1;
            iVar39 = iVar38 + -1;
            bVar50 = 0 < iVar38;
            iVar38 = iVar39;
          } while (iVar39 != 0 && bVar50);
        } while( true );
      }
    }
    else {
      if (iVar19 == 8) {
        sVar45 = s->img_x;
      }
      else {
        if (iVar19 != 4) {
          free(puVar24);
          stbi__g_failure_reason = "bad bpp";
          return (void *)0x0;
        }
        sVar45 = s->img_x + 1 >> 1;
      }
      uVar28 = 0;
      local_48 = -sVar45 & 3;
      for (iVar18 = 0; sVar45 = s->img_y, iVar18 < (int)sVar45; iVar18 = iVar18 + 1) {
        for (iVar38 = 0; iVar38 < (int)s->img_x; iVar38 = iVar38 + 2) {
          bVar10 = stbi__get8(s);
          uVar37 = bVar10 & 0xf;
          uVar49 = (uint)(bVar10 >> 4);
          if (iVar19 != 4) {
            uVar49 = (uint)bVar10;
          }
          uVar47 = (ulong)uVar49;
          if (iVar19 != 4) {
            uVar37 = 0;
          }
          lVar21 = (long)(int)uVar28;
          uVar34 = lVar21 + 3;
          puVar24[lVar21] = (uchar)data[uVar47 * 2 + -4];
          puVar24[lVar21 + 1] = *(uchar *)((long)data + uVar47 * 4 + -7);
          puVar24[lVar21 + 2] = (uchar)data[uVar47 * 2 + -3];
          if (iVar13 == 4) {
            puVar24[uVar34] = 0xff;
            uVar34 = (ulong)((int)uVar28 + 4);
          }
          if (iVar38 + 1U == s->img_x) {
            uVar28 = uVar34 & 0xffffffff;
            break;
          }
          if (iVar19 == 8) {
            bVar10 = stbi__get8(s);
            uVar37 = (uint)bVar10;
          }
          lVar21 = (long)(int)uVar34;
          uVar28 = lVar21 + 3;
          uVar47 = (ulong)uVar37;
          puVar24[lVar21] = (uchar)data[uVar47 * 2 + -4];
          puVar24[lVar21 + 1] = *(uchar *)((long)data + uVar47 * 4 + -7);
          puVar24[lVar21 + 2] = (uchar)data[uVar47 * 2 + -3];
          if (iVar13 == 4) {
            puVar24[uVar28] = 0xff;
            uVar28 = (ulong)((int)uVar34 + 4);
          }
        }
        stbi__skip(s,local_48);
      }
    }
    goto LAB_0011e849;
  }
  stbi__skip(s,(auStack_c8._4_4_ - (int)coutput[0]) + -0xe);
  if (iVar19 == 0x10) {
    coutput[3]._4_4_ = s->img_x * 2 & 2;
LAB_0011dc46:
    if (coutput[1]._4_4_ == 0 || ((uint)coutput[1] == 0 || coutput[0]._4_4_ == 0)) {
      free(puVar24);
      stbi__g_failure_reason = "bad masks";
      return (void *)0x0;
    }
    local_58 = stbi__high_bit(coutput[0]._4_4_);
    local_58 = local_58 + -7;
    iVar18 = stbi__bitcount(coutput[0]._4_4_);
    iVar38 = stbi__high_bit((uint)coutput[1]);
    iVar38 = iVar38 + -7;
    local_98 = stbi__bitcount((uint)coutput[1]);
    iVar39 = stbi__high_bit(coutput[1]._4_4_);
    iVar39 = iVar39 + -7;
    iVar15 = stbi__bitcount(coutput[1]._4_4_);
    local_94 = stbi__high_bit(uVar49);
    local_94 = local_94 + -7;
    local_d0 = stbi__bitcount(uVar49);
    bVar8 = true;
    bVar50 = false;
  }
  else {
    if (iVar19 == 0x20) {
      coutput[3]._4_4_ = 0;
      if (!(bool)((coutput[0]._4_4_ == 0xff0000 &&
                  ((uint)coutput[1] == 0xff00 && coutput[1]._4_4_ == 0xff)) & bVar50))
      goto LAB_0011dc46;
      bVar50 = true;
    }
    else {
      coutput[3]._4_4_ = 0;
      if (iVar19 != 0x18) goto LAB_0011dc46;
      coutput[3]._4_4_ = s->img_x & 3;
      bVar50 = false;
    }
    bVar8 = false;
    local_58 = 0;
    iVar38 = 0;
    iVar39 = 0;
    local_94 = 0;
    iVar18 = 0;
    local_98 = 0;
    iVar15 = 0;
    local_d0 = 0;
  }
  iVar16 = 0;
  for (iVar35 = 0; sVar45 = s->img_y, iVar35 < (int)sVar45; iVar35 = iVar35 + 1) {
    if (bVar8) {
      for (iVar36 = 0; iVar36 < (int)s->img_x; iVar36 = iVar36 + 1) {
        if (iVar19 == 0x10) {
          uVar37 = stbi__get16le(s);
        }
        else {
          uVar37 = stbi__get32le(s);
        }
        iVar17 = stbi__shiftsigned(uVar37 & coutput[0]._4_4_,local_58,iVar18);
        lVar21 = (long)iVar16;
        puVar24[lVar21] = (uchar)iVar17;
        iVar17 = stbi__shiftsigned(uVar37 & (uint)coutput[1],iVar38,local_98);
        puVar24[lVar21 + 1] = (uchar)iVar17;
        iVar17 = stbi__shiftsigned(uVar37 & coutput[1]._4_4_,iVar39,iVar15);
        puVar24[lVar21 + 2] = (uchar)iVar17;
        if (uVar49 == 0) {
          uVar37 = 0xff;
        }
        else {
          uVar37 = stbi__shiftsigned(uVar37 & uVar49,local_94,local_d0);
        }
        uVar28 = lVar21 + 3;
        if (iVar13 == 4) {
          puVar24[uVar28] = (uchar)uVar37;
          uVar28 = (ulong)(iVar16 + 4);
        }
        local_78 = local_78 | uVar37;
        iVar16 = (int)uVar28;
      }
    }
    else {
      for (iVar36 = 0; iVar36 < (int)s->img_x; iVar36 = iVar36 + 1) {
        sVar12 = stbi__get8(s);
        lVar21 = (long)iVar16;
        puVar24[lVar21 + 2] = sVar12;
        sVar12 = stbi__get8(s);
        puVar24[lVar21 + 1] = sVar12;
        sVar12 = stbi__get8(s);
        puVar24[lVar21] = sVar12;
        bVar10 = 0xff;
        if (bVar50) {
          bVar10 = stbi__get8(s);
        }
        uVar28 = lVar21 + 3;
        if (iVar13 == 4) {
          puVar24[uVar28] = bVar10;
          uVar28 = (ulong)(iVar16 + 4);
        }
        local_78 = local_78 | bVar10;
        iVar16 = (int)uVar28;
      }
    }
    stbi__skip(s,coutput[3]._4_4_);
  }
LAB_0011e849:
  if ((iVar13 == 4) && (local_78 == 0)) {
    for (uVar49 = s->img_x * sVar45 * 4 - 1; -1 < (int)uVar49; uVar49 = uVar49 - 4) {
      puVar24[uVar49] = 0xff;
    }
  }
  if (0 < (int)sVar14) {
    iVar19 = (int)sVar45 >> 1;
    if ((int)sVar45 >> 1 < 1) {
      iVar19 = 0;
    }
    iVar38 = (sVar45 - 1) * iVar13;
    iVar18 = 0;
    for (iVar39 = 0; iVar39 != iVar19; iVar39 = iVar39 + 1) {
      sVar14 = s->img_x;
      uVar49 = sVar14 * iVar13;
      if ((int)(sVar14 * iVar13) < 1) {
        uVar49 = 0;
      }
      for (uVar28 = 0; uVar49 != uVar28; uVar28 = uVar28 + 1) {
        uVar3 = puVar24[uVar28 + sVar14 * iVar18];
        puVar24[uVar28 + sVar14 * iVar18] = puVar24[uVar28 + sVar14 * iVar38];
        puVar24[uVar28 + sVar14 * iVar38] = uVar3;
      }
      iVar38 = iVar38 - iVar13;
      iVar18 = iVar18 + iVar13;
    }
  }
  uVar49 = s->img_x;
  if ((req_comp != 0) && (iVar13 != req_comp)) {
    puVar24 = stbi__convert_format(puVar24,iVar13,req_comp,uVar49,sVar45);
    if (puVar24 == (uchar *)0x0) {
      return (void *)0x0;
    }
    uVar49 = s->img_x;
  }
  *x = uVar49;
  *y = s->img_y;
  if (comp != (int *)0x0) {
    *comp = s->img_n;
    return puVar24;
  }
  return puVar24;
LAB_0011d15c:
  bVar50 = false;
LAB_0011d15e:
  if (!bVar50) goto LAB_0011da0b;
LAB_0011d166:
  bVar10 = psVar20->marker;
LAB_0011d170:
  if (bVar10 == 0xff) {
    do {
      iVar13 = stbi__at_eof(psVar20->s);
      if (iVar13 != 0) goto LAB_0011c7aa;
      sVar12 = stbi__get8(psVar20->s);
    } while (sVar12 != 0xff);
    sVar12 = stbi__get8(psVar20->s);
    psVar20->marker = sVar12;
  }
LAB_0011c7aa:
  bVar10 = stbi__get_marker(psVar20);
  goto LAB_0011c754;
LAB_0011d74b:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0011da0b;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}